

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void SstFFSWriterEndStep(SstStream Stream,size_t Timestep)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  SstStream in_RDI;
  FFSFormatBlock *Tmp;
  size_t *tmp;
  FFSMetadataInfoStruct *MBase;
  size_t AttributeSize;
  size_t DataSize;
  size_t MetaDataSize;
  _SstData AttributeRec;
  _SstData MetaDataRec;
  _SstData DataRec;
  FFSBuffer AttributeEncodeBuffer;
  FFSBuffer DataEncodeBuffer;
  FFSBuffer MetaEncodeBuffer;
  FFSTimestepInfo TSInfo;
  int size_2;
  FMFormat Format_2;
  FFSFormatBlock *Block_2;
  int size_1;
  FMFormat Format_1;
  FMStructDescRec struct_list_1 [4];
  FFSFormatBlock *Block_1;
  int size;
  FMFormat Format;
  FMStructDescRec struct_list [4];
  FFSFormatBlock *Block;
  FMFormat AttributeFormat;
  FFSFormatBlock *Formats;
  FFSWriterMarshalBase *Info;
  SstStream in_stack_fffffffffffffdd0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  undefined8 local_1b0;
  undefined8 local_1a8;
  long local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 *local_188;
  int local_17c;
  undefined8 local_178;
  undefined8 *local_170;
  int local_164;
  undefined8 local_160;
  char *local_158;
  DataFreeFunc in_stack_fffffffffffffec8;
  FFSFormatList in_stack_fffffffffffffed0;
  ssize_t in_stack_fffffffffffffed8;
  SstData in_stack_fffffffffffffee0;
  SstData in_stack_fffffffffffffee8;
  SstStream in_stack_fffffffffffffef0;
  void *in_stack_ffffffffffffff00;
  SstData in_stack_ffffffffffffff08;
  DataFreeFunc in_stack_ffffffffffffff10;
  void *in_stack_ffffffffffffff18;
  int local_c4;
  undefined8 local_c0;
  char *local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined8 *local_38;
  undefined8 local_30;
  undefined8 *local_28;
  void *local_20;
  SstStream local_10;
  
  local_28 = (undefined8 *)0x0;
  local_30 = 0;
  local_10 = in_RDI;
  if (_perfstubs_initialized == 1) {
    if (SstFFSWriterEndStep::timer == (void *)0x0) {
      SstFFSWriterEndStep::timer =
           (void *)ps_timer_create_("Marshaling overhead in SstFFSWriterEndStep");
    }
    ps_timer_start_(SstFFSWriterEndStep::timer);
  }
  CP_verbose(local_10,PerStepVerbose,"Calling SstWriterEndStep\n");
  if (local_10->WriterMarshalData == (void *)0x0) {
    InitMarshalData(in_stack_fffffffffffffdd0);
  }
  local_20 = local_10->WriterMarshalData;
  if ((*(long *)((long)local_20 + 0x28) == 0) && (*(int *)((long)local_20 + 0x18) != 0)) {
    local_38 = (undefined8 *)malloc(0x28);
    memcpy(&local_b8,&DAT_01139d10,0x80);
    local_b8 = "MetaData";
    local_b0 = *(undefined8 *)((long)local_20 + 0x20);
    local_a8 = FMstruct_size_field_list(*(undefined8 *)((long)local_20 + 0x20),8);
    local_c0 = register_data_format(*(undefined8 *)((long)local_20 + 0x10),&local_b8);
    *(undefined8 *)((long)local_20 + 0x28) = local_c0;
    uVar4 = get_server_rep_FMformat(local_c0,&local_c4);
    *local_38 = uVar4;
    local_38[1] = (long)local_c4;
    uVar4 = get_server_ID_FMformat(local_c0,&local_c4);
    local_38[2] = uVar4;
    local_38[3] = (long)local_c4;
    local_38[4] = 0;
    local_28 = local_38;
  }
  puVar5 = local_28;
  if ((*(long *)((long)local_20 + 0x40) == 0) && (*(int *)((long)local_20 + 0x30) != 0)) {
    puVar5 = (undefined8 *)malloc(0x28);
    memcpy(&local_158,&DAT_01139d90,0x80);
    local_158 = "Data";
    FMstruct_size_field_list(*(undefined8 *)((long)local_20 + 0x38),8);
    local_160 = register_data_format(*(undefined8 *)((long)local_20 + 0x10),&local_158);
    *(undefined8 *)((long)local_20 + 0x40) = local_160;
    uVar4 = get_server_rep_FMformat(local_160,&local_164);
    *puVar5 = uVar4;
    puVar5[1] = (long)local_164;
    uVar4 = get_server_ID_FMformat(local_160,&local_164);
    puVar5[2] = uVar4;
    puVar5[3] = (long)local_164;
    puVar5[4] = 0;
    if (local_28 != (undefined8 *)0x0) {
      puVar5[4] = local_28;
    }
  }
  local_28 = puVar5;
  if (*(long *)((long)local_20 + 0x50) != 0) {
    local_170 = (undefined8 *)calloc(1,0x28);
    uVar4 = *(undefined8 *)((long)local_20 + 0x10);
    uVar1 = *(undefined8 *)((long)local_20 + 0x50);
    uVar3 = FMstruct_size_field_list(*(undefined8 *)((long)local_20 + 0x50),8);
    local_178 = FMregister_simple_format(uVar4,"Attributes",uVar1,uVar3);
    local_30 = local_178;
    uVar4 = get_server_rep_FMformat(local_178,&local_17c);
    *local_170 = uVar4;
    local_170[1] = (long)local_17c;
    uVar4 = get_server_ID_FMformat(local_178,&local_17c);
    local_170[2] = uVar4;
    local_170[3] = (long)local_17c;
    local_170[4] = 0;
    if (local_28 != (undefined8 *)0x0) {
      local_170[4] = local_28;
    }
    local_28 = local_170;
  }
  local_188 = (undefined8 *)malloc(0x10);
  local_190 = create_FFSBuffer();
  local_198 = create_FFSBuffer();
  local_1a0 = 0;
  local_1e8 = 0;
  if (*(long *)((long)local_20 + 0x40) == 0) {
    local_1a8 = 0;
    local_1b0 = 0;
  }
  else {
    local_1a8 = FFSencode(local_198,*(undefined8 *)((long)local_20 + 0x40),local_10->D,&local_1e0);
    local_1b0 = local_1e0;
  }
  local_188[1] = local_198;
  *(undefined8 *)((long)local_10->M + 0x10) = local_1b0;
  local_1e0 = local_1b0;
  local_1b8 = FFSencode(local_190,*(undefined8 *)((long)local_20 + 0x28),local_10->M,&local_1d8);
  local_1c0 = local_1d8;
  *local_188 = local_190;
  if (*(long *)((long)local_20 + 0x50) == 0) {
    local_1c8 = 0;
    local_1d0 = 0;
  }
  else {
    local_1a0 = create_FFSBuffer();
    local_1c8 = FFSencode(local_1a0,local_30,*(undefined8 *)((long)local_20 + 0x60),&local_1e8);
    local_1d0 = local_1e8;
  }
  pvVar2 = local_10->M;
  uVar4 = *(undefined8 *)((long)pvVar2 + 8);
  *(undefined8 *)((long)pvVar2 + 8) = 0;
  if (*(long *)((long)local_20 + 0x28) != 0) {
    FMfree_var_rec_elements(*(undefined8 *)((long)local_20 + 0x28));
  }
  if (*(long *)((long)local_20 + 0x40) != 0) {
    FMfree_var_rec_elements(*(undefined8 *)((long)local_20 + 0x40));
  }
  if ((local_10->M != (void *)0x0) && (local_10->MetadataSize != 0)) {
    memset(local_10->M,0,local_10->MetadataSize);
  }
  if ((local_10->D != (void *)0x0) && (local_10->DataSize != 0)) {
    memset(local_10->D,0,local_10->DataSize);
  }
  *(undefined8 *)((long)pvVar2 + 8) = uVar4;
  if (_perfstubs_initialized == 1) {
    ps_timer_stop_(SstFFSWriterEndStep::timer);
  }
  SstInternalProvideTimestep
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff18);
  if (local_1a0 != 0) {
    free_FFSBuffer(local_1a0);
  }
  while (local_28 != (undefined8 *)0x0) {
    puVar5 = (undefined8 *)local_28[4];
    free(local_28);
    local_28 = puVar5;
  }
  if (*(long *)((long)local_20 + 0x50) != 0) {
    free_FMfield_list(*(undefined8 *)((long)local_20 + 0x50));
  }
  *(undefined8 *)((long)local_20 + 0x50) = 0;
  *(undefined4 *)((long)local_20 + 0x48) = 0;
  if (*(long *)((long)local_20 + 0x60) != 0) {
    free(*(void **)((long)local_20 + 0x60));
  }
  *(undefined8 *)((long)local_20 + 0x60) = 0;
  *(undefined4 *)((long)local_20 + 0x68) = 0;
  return;
}

Assistant:

extern void SstFFSWriterEndStep(SstStream Stream, size_t Timestep)
{
    struct FFSWriterMarshalBase *Info;
    struct FFSFormatBlock *Formats = NULL;
    FMFormat AttributeFormat = NULL;

    PERFSTUBS_TIMER_START(timer, "Marshaling overhead in SstFFSWriterEndStep");

    CP_verbose(Stream, PerStepVerbose, "Calling SstWriterEndStep\n");
    // if field lists have changed, register formats with FFS local context, add
    // to format chain
    if (!Stream->WriterMarshalData)
    {
        InitMarshalData(Stream);
    }
    Info = (struct FFSWriterMarshalBase *)Stream->WriterMarshalData;
    if (!Info->MetaFormat && Info->MetaFieldCount)
    {
        struct FFSFormatBlock *Block = malloc(sizeof(*Block));
        FMStructDescRec struct_list[4] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = "MetaData";
        struct_list[0].field_list = Info->MetaFields;
        struct_list[0].struct_size = FMstruct_size_field_list(Info->MetaFields, sizeof(char *));

        FMFormat Format = register_data_format(Info->LocalFMContext, &struct_list[0]);
        Info->MetaFormat = Format;
        int size;
        Block->FormatServerRep = get_server_rep_FMformat(Format, &size);
        Block->FormatServerRepLen = size;
        Block->FormatIDRep = get_server_ID_FMformat(Format, &size);
        Block->FormatIDRepLen = size;
        Block->Next = NULL;
        Formats = Block;
    }
    if (!Info->DataFormat && Info->DataFieldCount)
    {
        struct FFSFormatBlock *Block = malloc(sizeof(*Block));
        FMStructDescRec struct_list[4] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = "Data";
        struct_list[0].field_list = Info->DataFields;
        struct_list[0].struct_size = FMstruct_size_field_list(Info->DataFields, sizeof(char *));
        FMFormat Format = register_data_format(Info->LocalFMContext, &struct_list[0]);
        Info->DataFormat = Format;
        int size;
        Block->FormatServerRep = get_server_rep_FMformat(Format, &size);
        Block->FormatServerRepLen = size;
        Block->FormatIDRep = get_server_ID_FMformat(Format, &size);
        Block->FormatIDRepLen = size;
        Block->Next = NULL;
        if (Formats)
        {
            Block->Next = Formats;
            Formats = Block;
        }
        else
        {
            Formats = Block;
        }
    }
    if (Info->AttributeFields)
    {
        struct FFSFormatBlock *Block = calloc(1, sizeof(*Block));
        FMFormat Format = FMregister_simple_format(
            Info->LocalFMContext, "Attributes", Info->AttributeFields,
            FMstruct_size_field_list(Info->AttributeFields, sizeof(char *)));
        AttributeFormat = Format;
        int size;
        Block->FormatServerRep = get_server_rep_FMformat(Format, &size);
        Block->FormatServerRepLen = size;
        Block->FormatIDRep = get_server_ID_FMformat(Format, &size);
        Block->FormatIDRepLen = size;
        Block->Next = NULL;
        if (Formats)
        {
            Block->Next = Formats;
            Formats = Block;
        }
        else
        {
            Formats = Block;
        }
    }
    // Encode Metadata and Data to create contiguous data blocks
    FFSTimestepInfo TSInfo = malloc(sizeof(*TSInfo));
    FFSBuffer MetaEncodeBuffer = create_FFSBuffer();
    FFSBuffer DataEncodeBuffer = create_FFSBuffer();
    FFSBuffer AttributeEncodeBuffer = NULL;
    struct _SstData DataRec;
    struct _SstData MetaDataRec;
    struct _SstData AttributeRec;
    size_t MetaDataSize;
    size_t DataSize;
    size_t AttributeSize = 0;
    struct FFSMetadataInfoStruct *MBase;
    if (Info->DataFormat)
    {
        DataRec.block = FFSencode(DataEncodeBuffer, Info->DataFormat, Stream->D, &DataSize);
        DataRec.DataSize = DataSize;
    }
    else
    {
        DataRec.block = NULL;
        DataRec.DataSize = 0;
        DataSize = 0;
    }
    TSInfo->DataEncodeBuffer = DataEncodeBuffer;

    MBase = Stream->M;
    MBase->DataBlockSize = DataSize;
    MetaDataRec.block = FFSencode(MetaEncodeBuffer, Info->MetaFormat, Stream->M, &MetaDataSize);
    MetaDataRec.DataSize = MetaDataSize;
    TSInfo->MetaEncodeBuffer = MetaEncodeBuffer;

    if (Info->AttributeFields)
    {
        AttributeEncodeBuffer = create_FFSBuffer();
        AttributeRec.block =
            FFSencode(AttributeEncodeBuffer, AttributeFormat, Info->AttributeData, &AttributeSize);
        AttributeRec.DataSize = AttributeSize;
    }
    else
    {
        AttributeRec.block = NULL;
        AttributeRec.DataSize = 0;
    }

    /* free all those copied dimensions, etc */
    MBase = Stream->M;
    size_t *tmp = MBase->BitField;
    /*
     * BitField value is saved away from FMfree_var_rec_elements() so that it
     * isn't unnecessarily free'd.
     */
    MBase->BitField = NULL;
    if (Info->MetaFormat)
        FMfree_var_rec_elements(Info->MetaFormat, Stream->M);
    if (Info->DataFormat)
        FMfree_var_rec_elements(Info->DataFormat, Stream->D);
    if (Stream->M && Stream->MetadataSize)
        memset(Stream->M, 0, Stream->MetadataSize);
    if (Stream->D && Stream->DataSize)
        memset(Stream->D, 0, Stream->DataSize);
    MBase->BitField = tmp;

    // Call SstInternalProvideStep with Metadata block, Data block and (any new)
    // formatID and formatBody
    //    printf("MetaDatablock is (Length %d):\n", MetaDataSize);
    //    FMdump_encoded_data(Info->MetaFormat, MetaDataRec.block, 1024000);
    //    printf("\nDatablock is :\n");
    //    FMdump_encoded_data(Info->DataFormat, DataRec.block, 1024000);
    //    if (AttributeEncodeBuffer) {
    //        printf("\nAttributeBlock is :\n");
    //        FMdump_encoded_data(AttributeFormat, AttributeRec.block, 1024000);
    //    }

    PERFSTUBS_TIMER_STOP(timer);

    SstInternalProvideTimestep(Stream, &MetaDataRec, &DataRec, Timestep, Formats, FreeTSInfo,
                               TSInfo, &AttributeRec, FreeAttrInfo, AttributeEncodeBuffer);
    if (AttributeEncodeBuffer)
    {
        free_FFSBuffer(AttributeEncodeBuffer);
    }
    while (Formats)
    {
        struct FFSFormatBlock *Tmp = Formats->Next;
        free(Formats);
        Formats = Tmp;
    }
    if (Info->AttributeFields)
        free_FMfield_list(Info->AttributeFields);
    Info->AttributeFields = NULL;
    Info->AttributeFieldCount = 0;
    if (Info->AttributeData)
        free(Info->AttributeData);
    Info->AttributeData = NULL;
    Info->AttributeSize = 0;
}